

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cpp
# Opt level: O0

void __thiscall ArgParser::displayInfo(ArgParser *this)

{
  FILE *pFVar1;
  undefined8 uVar2;
  size_type sVar3;
  reference pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  string type;
  size_t i;
  ArgParser *this_local;
  
  pFVar1 = _stderr;
  uVar2 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"%s\nAvailable options:\n",uVar2);
  for (type.field_2._8_8_ = 0; uVar2 = type.field_2._8_8_,
      sVar3 = std::vector<ArgHolder,_std::allocator<ArgHolder>_>::size(&this->m_args),
      pFVar1 = _stderr, (ulong)uVar2 < sVar3; type.field_2._8_8_ = type.field_2._8_8_ + 1) {
    std::__cxx11::string::string((string *)local_38);
    pvVar4 = std::vector<ArgHolder,_std::allocator<ArgHolder>_>::operator[]
                       (&this->m_args,type.field_2._8_8_);
    switch(pvVar4->argType) {
    case ARG_NONE:
    case ARG_FLAG:
      std::__cxx11::string::operator=((string *)local_38,"");
      break;
    case ARG_UINT:
      std::__cxx11::string::operator=((string *)local_38," <int>");
      break;
    case ARG_FLOAT:
      std::__cxx11::string::operator=((string *)local_38," <float>");
      break;
    case ARG_STRING:
      std::__cxx11::string::operator=((string *)local_38," <string>");
    }
    pFVar1 = _stderr;
    pvVar4 = std::vector<ArgHolder,_std::allocator<ArgHolder>_>::operator[]
                       (&this->m_args,type.field_2._8_8_);
    std::operator+(&local_88,&pvVar4->shortName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    std::operator+(&local_68,&local_88,",");
    uVar2 = std::__cxx11::string::c_str();
    pvVar4 = std::vector<ArgHolder,_std::allocator<ArgHolder>_>::operator[]
                       (&this->m_args,type.field_2._8_8_);
    std::operator+(&local_a8,&pvVar4->name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    uVar5 = std::__cxx11::string::c_str();
    std::vector<ArgHolder,_std::allocator<ArgHolder>_>::operator[](&this->m_args,type.field_2._8_8_)
    ;
    uVar6 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"  %-15s  %-25s\t:  %s\n",uVar2,uVar5,uVar6);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)local_38);
  }
  uVar2 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"%s\n",uVar2);
  return;
}

Assistant:

void ArgParser::displayInfo()
{
    fprintf(stderr, "%s\nAvailable options:\n", m_preInfo.c_str());
    for (size_t i=0; i<m_args.size(); i++)
    {
        std::string type;
        switch (m_args[i].argType)
        {
        case ARG_UINT:
            type = " <int>";
            break;
        case ARG_FLOAT:
            type = " <float>";
            break;
        case ARG_STRING:
            type = " <string>";
            break;
        case ARG_FLAG:
        case ARG_NONE:
            type = "";
            break;
        }
        fprintf(stderr, "  %-15s  %-25s\t:  %s\n",
                (m_args[i].shortName + type + ",").c_str(),
                (m_args[i].name + type).c_str(),
                m_args[i].description.c_str());
    }
    fprintf(stderr, "%s\n", m_postInfo.c_str());
}